

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<const_pbrt::RGBColorSpace_*>::optional
          (optional<const_pbrt::RGBColorSpace_*> *this,optional<const_pbrt::RGBColorSpace_*> *v)

{
  bool bVar1;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  *paVar2;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    paVar2 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              *)value(v);
    this->optionalValue = *paVar2;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }